

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

bitset_container_t * bitset_container_from_array(array_container_t *ac)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  bitset_container_t *pbVar6;
  ulong uVar7;
  int32_t iVar8;
  long lVar9;
  
  pbVar6 = bitset_container_create();
  iVar2 = ac->cardinality;
  if (0 < (long)iVar2) {
    puVar3 = ac->array;
    puVar4 = pbVar6->words;
    iVar8 = pbVar6->cardinality;
    lVar9 = 0;
    do {
      uVar1 = puVar3[lVar9];
      uVar5 = puVar4[uVar1 >> 6];
      uVar7 = uVar5 | 1L << ((ulong)uVar1 & 0x3f);
      iVar8 = iVar8 + (int)((uVar5 ^ uVar7) >> ((byte)uVar1 & 0x3f));
      puVar4[uVar1 >> 6] = uVar7;
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
    pbVar6->cardinality = iVar8;
  }
  return pbVar6;
}

Assistant:

bitset_container_t *bitset_container_from_array(const array_container_t *ac) {
    bitset_container_t *ans = bitset_container_create();
    int limit = array_container_cardinality(ac);
    for (int i = 0; i < limit; ++i) bitset_container_set(ans, ac->array[i]);
    return ans;
}